

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O1

bool sptk::ReadStream<long_double>
               (bool zero_padding,int stream_skip,int read_point,int read_size,
               vector<long_double,_std::allocator<long_double>_> *sequence_to_read,
               istream *input_stream,int *actual_read_size)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong __new_size;
  int iVar6;
  double dVar7;
  
  if ((((input_stream != (istream *)0x0 &&
        sequence_to_read != (vector<long_double,_std::allocator<long_double>_> *)0x0) &&
        (0 < read_size && -1 < (read_point | stream_skip))) &&
      (((byte)input_stream[*(long *)(*(long *)input_stream + -0x18) + 0x20] & 2) == 0)) &&
     ((stream_skip < 1 ||
      (std::istream::ignore((long)input_stream),
      ((byte)input_stream[*(long *)(*(long *)input_stream + -0x18) + 0x20] & 2) == 0)))) {
    __new_size = (ulong)(uint)(read_size + read_point);
    if ((ulong)(*(long *)(sequence_to_read + 8) - *(long *)sequence_to_read >> 4) < __new_size) {
      std::vector<long_double,_std::allocator<long_double>_>::resize(sequence_to_read,__new_size);
    }
    std::istream::read((char *)input_stream,
                       (ulong)(uint)read_point * 0x10 + *(long *)sequence_to_read);
    iVar1 = *(int *)(input_stream + 8);
    if (actual_read_size != (int *)0x0) {
      iVar6 = iVar1 + 0xf;
      if (-1 < iVar1) {
        iVar6 = iVar1;
      }
      *actual_read_size = iVar6 >> 4;
    }
    uVar3 = 5;
    iVar6 = read_size * 0x10 - iVar1;
    if (iVar6 == 0) {
LAB_00109f16:
      return (*(uint *)(input_stream + *(long *)(*(long *)input_stream + -0x18) + 0x20) & uVar3) ==
             0;
    }
    if (zero_padding && 0 < iVar1) {
      dVar7 = ceil((double)iVar6 * 0.0625);
      uVar4 = (uint)dVar7;
      if (-1 < (int)uVar4) {
        uVar3 = 1;
        if (uVar4 != 0) {
          lVar2 = *(long *)sequence_to_read;
          lVar5 = (ulong)uVar4 * -0x10;
          do {
            *(longdouble *)(__new_size * 0x10 + lVar2 + lVar5) = (longdouble)0;
            lVar5 = lVar5 + 0x10;
          } while (lVar5 != 0);
        }
        goto LAB_00109f16;
      }
    }
  }
  return false;
}

Assistant:

bool ReadStream(bool zero_padding, int stream_skip, int read_point,
                int read_size, std::vector<T>* sequence_to_read,
                std::istream* input_stream, int* actual_read_size) {
  if (stream_skip < 0 || read_point < 0 || read_size <= 0 ||
      NULL == sequence_to_read || NULL == input_stream || input_stream->eof()) {
    return false;
  }

  const int type_byte(sizeof((*sequence_to_read)[0]));

  if (0 < stream_skip) {
    input_stream->ignore(type_byte * stream_skip);
    if (input_stream->eof()) return false;
  }

  const int end(read_point + read_size);
  if (sequence_to_read->size() < static_cast<std::size_t>(end)) {
    sequence_to_read->resize(end);
  }

  const int num_read_bytes(type_byte * read_size);
  input_stream->read(
      reinterpret_cast<char*>(&((*sequence_to_read)[0]) + read_point),
      num_read_bytes);

  const int gcount(static_cast<int>(input_stream->gcount()));
  if (NULL != actual_read_size) {
    *actual_read_size = gcount / type_byte;
  }

  if (num_read_bytes == gcount) {
    return !input_stream->fail();
  } else if (zero_padding && 0 < gcount) {
    // Use std::ceil to zero incomplete data
    // as gcount may not be a multiple of sizeof(double).
    const int num_zeros(static_cast<int>(
        std::ceil(static_cast<double>(num_read_bytes - gcount) / type_byte)));
    if (num_zeros < 0) {
      return false;  // Something wrong!
    }

    std::fill_n(sequence_to_read->begin() + end - num_zeros, num_zeros,
                static_cast<T>(0));

    return !input_stream->bad();
  }

  return false;
}